

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O0

void __thiscall PixelToaster::UnixDisplay::title(UnixDisplay *this,char *title)

{
  char *title_local;
  UnixDisplay *this_local;
  
  DisplayAdapter::title(&this->super_DisplayAdapter,title);
  if ((this->display_ != (Display *)0x0) && (this->window_ != 0)) {
    XStoreName(this->display_,this->window_,title);
  }
  return;
}

Assistant:

void title(const char title[]) override
    {
        DisplayAdapter::title(title);

        if (display_ && window_)
            ::XStoreName(display_, window_, title);
    }